

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_srgb_BGRA(void *outputp,int width_times_channels,float *encode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  stbir_uint8 sVar23;
  undefined8 *puVar24;
  float *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m128i temp_3;
  __m128i temp_2;
  __m128i temp_1;
  __m128i temp;
  stbir__simdi_u32 temp3;
  stbir__simdi_u32 temp2;
  stbir__simdi_u32 temp1;
  stbir__simdi_u32 temp0;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  __m128 tmp0;
  __m128i i3;
  __m128i i2;
  __m128i i1;
  __m128i i0;
  __m128 f3;
  __m128 f2;
  __m128 f1;
  __m128 f0;
  float *end_encode_m16;
  uchar *end_output;
  uchar *output;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_738;
  float *local_730;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short sStack_580;
  short sStack_57e;
  short sStack_57c;
  short sStack_57a;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  
  puVar24 = (undefined8 *)((long)in_RDI + (long)in_ESI);
  if (in_ESI < 0x10) {
    local_730 = in_RDX;
    for (local_738 = (undefined8 *)((long)in_RDI + 4); local_738 <= puVar24;
        local_738 = (undefined8 *)((long)local_738 + 4)) {
      sVar23 = stbir__linear_to_srgb_uchar(local_730[2]);
      *(stbir_uint8 *)((long)local_738 + -4) = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(local_730[1]);
      *(stbir_uint8 *)((long)local_738 + -3) = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(*local_730);
      *(stbir_uint8 *)((long)local_738 + -2) = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(local_730[3]);
      *(stbir_uint8 *)((long)local_738 + -1) = sVar23;
      local_730 = local_730 + 4;
    }
  }
  else {
    local_738 = in_RDI;
    local_730 = in_RDX;
    do {
      do {
        local_4c8 = (undefined4)*(undefined8 *)local_730;
        uStack_4c4 = (undefined4)((ulong)*(undefined8 *)local_730 >> 0x20);
        local_4d8 = (undefined4)*(undefined8 *)(local_730 + 4);
        uStack_4d4 = (undefined4)((ulong)*(undefined8 *)(local_730 + 4) >> 0x20);
        local_4e8 = (undefined4)*(undefined8 *)(local_730 + 8);
        uStack_4e4 = (undefined4)((ulong)*(undefined8 *)(local_730 + 8) >> 0x20);
        local_4f8 = (undefined4)*(undefined8 *)(local_730 + 0xc);
        uStack_4f4 = (undefined4)((ulong)*(undefined8 *)(local_730 + 0xc) >> 0x20);
        uStack_480 = (undefined4)*(undefined8 *)(local_730 + 2);
        uStack_47c = (undefined4)((ulong)*(undefined8 *)(local_730 + 2) >> 0x20);
        uStack_490 = (undefined4)*(undefined8 *)(local_730 + 6);
        uStack_48c = (undefined4)((ulong)*(undefined8 *)(local_730 + 6) >> 0x20);
        uStack_4a0 = (undefined4)*(undefined8 *)(local_730 + 10);
        uStack_49c = (undefined4)((ulong)*(undefined8 *)(local_730 + 10) >> 0x20);
        uStack_4b0 = (undefined4)*(undefined8 *)(local_730 + 0xe);
        uStack_4ac = (undefined4)((ulong)*(undefined8 *)(local_730 + 0xe) >> 0x20);
        auVar6._4_4_ = local_4d8;
        auVar6._0_4_ = local_4c8;
        auVar6._12_4_ = local_4f8;
        auVar6._8_4_ = local_4e8;
        auVar4._12_4_ = uStack_4f4;
        auVar4._8_4_ = uStack_4e4;
        auVar4._4_4_ = uStack_4d4;
        auVar4._0_4_ = uStack_4c4;
        auVar2._4_4_ = uStack_490;
        auVar2._0_4_ = uStack_480;
        auVar2._12_4_ = uStack_4b0;
        auVar2._8_4_ = uStack_4a0;
        auVar27._12_4_ = uStack_4ac;
        auVar27._8_4_ = uStack_49c;
        auVar27._4_4_ = uStack_48c;
        auVar27._0_4_ = uStack_47c;
        auVar5._8_8_ = 0x3900000039000000;
        auVar5._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar6,auVar5);
        auVar10._8_8_ = 0x3f7fffff3f7fffff;
        auVar10._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar10);
        local_188 = auVar26._0_4_;
        uStack_184 = auVar26._4_4_;
        uStack_180 = auVar26._8_4_;
        uStack_17c = auVar26._12_4_;
        auVar3._8_8_ = 0x3900000039000000;
        auVar3._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar4,auVar3);
        auVar9._8_8_ = 0x3f7fffff3f7fffff;
        auVar9._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar9);
        local_1a8 = auVar26._0_4_;
        uStack_1a4 = auVar26._4_4_;
        uStack_1a0 = auVar26._8_4_;
        uStack_19c = auVar26._12_4_;
        auVar1._8_8_ = 0x3900000039000000;
        auVar1._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar2,auVar1);
        auVar8._8_8_ = 0x3f7fffff3f7fffff;
        auVar8._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar8);
        local_1c8 = auVar26._0_4_;
        uStack_1c4 = auVar26._4_4_;
        uStack_1c0 = auVar26._8_4_;
        uStack_1bc = auVar26._12_4_;
        auVar26._8_8_ = 0x3900000039000000;
        auVar26._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar27,auVar26);
        auVar7._8_8_ = 0x3f7fffff3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar7);
        local_1e8 = auVar26._0_4_;
        uStack_1e4 = auVar26._4_4_;
        uStack_1e0 = auVar26._8_4_;
        uStack_1dc = auVar26._12_4_;
        local_818 = CONCAT44(*(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(uStack_184 >> 0x14) * 4 + 0xd0),
                             *(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(local_188 >> 0x14) * 4 + 0xd0));
        uStack_810 = CONCAT44(*(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_17c >> 0x14) * 4 + 0xd0),
                              *(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_180 >> 0x14) * 4 + 0xd0));
        local_828 = CONCAT44(*(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(uStack_1a4 >> 0x14) * 4 + 0xd0),
                             *(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(local_1a8 >> 0x14) * 4 + 0xd0));
        uStack_820 = CONCAT44(*(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_19c >> 0x14) * 4 + 0xd0),
                              *(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_1a0 >> 0x14) * 4 + 0xd0));
        local_838 = CONCAT44(*(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(uStack_1c4 >> 0x14) * 4 + 0xd0),
                             *(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(local_1c8 >> 0x14) * 4 + 0xd0));
        uStack_830 = CONCAT44(*(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_1bc >> 0x14) * 4 + 0xd0),
                              *(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_1c0 >> 0x14) * 4 + 0xd0));
        local_848 = CONCAT44(*(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(uStack_1e4 >> 0x14) * 4 + 0xd0),
                             *(undefined4 *)
                              (
                              "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                              + (long)(int)(local_1e8 >> 0x14) * 4 + 0xd0));
        uStack_840 = CONCAT44(*(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_1dc >> 0x14) * 4 + 0xd0),
                              *(undefined4 *)
                               (
                               "NSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS3_6filterIZNS3_3cpu19deconv2x2_avx_floatItLi8ELi1EEEvRKNS3_5ImageERS8_PKfEUliiPKvPvE_JS9_S8_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS8_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSK_EUliE_EEvSP_SP_OT0_EUliE_iEESaIiEFvvEEE"
                               + (long)(int)(uStack_1e0 >> 0x14) * 4 + 0xd0));
        local_858 = CONCAT44(uStack_184 >> 0xc,local_188 >> 0xc);
        uStack_850 = CONCAT44(uStack_17c >> 0xc,uStack_180 >> 0xc);
        auVar18._8_8_ = uStack_810;
        auVar18._0_8_ = local_818;
        auVar17._8_8_ = uStack_850 & 0xff000000ff | 0x200000002000000;
        auVar17._0_8_ = local_858 & 0xff000000ff | 0x200000002000000;
        auVar26 = pmaddwd(auVar18,auVar17);
        local_228 = auVar26._0_4_;
        uStack_224 = auVar26._4_4_;
        uStack_220 = auVar26._8_4_;
        uStack_21c = auVar26._12_4_;
        local_798 = CONCAT44(uStack_224 >> 0x10,local_228 >> 0x10);
        uStack_790._0_4_ = uStack_220 >> 0x10;
        uStack_790._4_4_ = uStack_21c >> 0x10;
        local_868 = CONCAT44(uStack_1a4 >> 0xc,local_1a8 >> 0xc);
        uStack_860 = CONCAT44(uStack_19c >> 0xc,uStack_1a0 >> 0xc);
        auVar16._8_8_ = uStack_820;
        auVar16._0_8_ = local_828;
        auVar15._8_8_ = uStack_860 & 0xff000000ff | 0x200000002000000;
        auVar15._0_8_ = local_868 & 0xff000000ff | 0x200000002000000;
        auVar26 = pmaddwd(auVar16,auVar15);
        local_268 = auVar26._0_4_;
        uStack_264 = auVar26._4_4_;
        uStack_260 = auVar26._8_4_;
        uStack_25c = auVar26._12_4_;
        local_7a8 = CONCAT44(uStack_264 >> 0x10,local_268 >> 0x10);
        uStack_7a0._0_4_ = uStack_260 >> 0x10;
        uStack_7a0._4_4_ = uStack_25c >> 0x10;
        local_878 = CONCAT44(uStack_1c4 >> 0xc,local_1c8 >> 0xc);
        uStack_870 = CONCAT44(uStack_1bc >> 0xc,uStack_1c0 >> 0xc);
        auVar14._8_8_ = uStack_830;
        auVar14._0_8_ = local_838;
        auVar13._8_8_ = uStack_870 & 0xff000000ff | 0x200000002000000;
        auVar13._0_8_ = local_878 & 0xff000000ff | 0x200000002000000;
        auVar26 = pmaddwd(auVar14,auVar13);
        local_2a8 = auVar26._0_4_;
        uStack_2a4 = auVar26._4_4_;
        uStack_2a0 = auVar26._8_4_;
        uStack_29c = auVar26._12_4_;
        local_7b8 = CONCAT44(uStack_2a4 >> 0x10,local_2a8 >> 0x10);
        uStack_7b0._0_4_ = uStack_2a0 >> 0x10;
        uStack_7b0._4_4_ = uStack_29c >> 0x10;
        local_888 = CONCAT44(uStack_1e4 >> 0xc,local_1e8 >> 0xc);
        uStack_880 = CONCAT44(uStack_1dc >> 0xc,uStack_1e0 >> 0xc);
        auVar12._8_8_ = uStack_840;
        auVar12._0_8_ = local_848;
        auVar11._8_8_ = uStack_880 & 0xff000000ff | 0x200000002000000;
        auVar11._0_8_ = local_888 & 0xff000000ff | 0x200000002000000;
        auVar26 = pmaddwd(auVar12,auVar11);
        local_2e8 = auVar26._0_4_;
        uStack_2e4 = auVar26._4_4_;
        uStack_2e0 = auVar26._8_4_;
        uStack_2dc = auVar26._12_4_;
        local_7c8 = CONCAT44(uStack_2e4 >> 0x10,local_2e8 >> 0x10);
        uStack_7c0._0_4_ = uStack_2e0 >> 0x10;
        uStack_7c0._4_4_ = uStack_2dc >> 0x10;
        auVar22._8_8_ = uStack_7b0;
        auVar22._0_8_ = local_7b8;
        auVar21._8_8_ = uStack_7a0;
        auVar21._0_8_ = local_7a8;
        auVar26 = packssdw(auVar22,auVar21);
        auVar20._8_8_ = uStack_790;
        auVar20._0_8_ = local_798;
        auVar19._8_8_ = uStack_7c0;
        auVar19._0_8_ = local_7c8;
        auVar27 = packssdw(auVar20,auVar19);
        local_6c8 = auVar26._0_2_;
        sStack_6c6 = auVar26._2_2_;
        sStack_6c4 = auVar26._4_2_;
        sStack_6c2 = auVar26._6_2_;
        local_6d8 = auVar27._0_2_;
        sStack_6d6 = auVar27._2_2_;
        sStack_6d4 = auVar27._4_2_;
        sStack_6d2 = auVar27._6_2_;
        sStack_580 = auVar26._8_2_;
        sStack_57e = auVar26._10_2_;
        sStack_57c = auVar26._12_2_;
        sStack_57a = auVar26._14_2_;
        sStack_590 = auVar27._8_2_;
        sStack_58e = auVar27._10_2_;
        sStack_58c = auVar27._12_2_;
        sStack_58a = auVar27._14_2_;
        local_7b8._0_2_ =
             CONCAT11((0 < sStack_580) * (sStack_580 < 0x100) * auVar26[8] - (0xff < sStack_580),
                      (0 < local_6c8) * (local_6c8 < 0x100) * auVar26[0] - (0xff < local_6c8));
        local_7b8._0_3_ =
             CONCAT12((0 < local_6d8) * (local_6d8 < 0x100) * auVar27[0] - (0xff < local_6d8),
                      (undefined2)local_7b8);
        local_7b8._0_4_ =
             CONCAT13((0 < sStack_590) * (sStack_590 < 0x100) * auVar27[8] - (0xff < sStack_590),
                      (undefined3)local_7b8);
        local_7b8._0_5_ =
             CONCAT14((0 < sStack_6c6) * (sStack_6c6 < 0x100) * auVar26[2] - (0xff < sStack_6c6),
                      (undefined4)local_7b8);
        local_7b8._0_6_ =
             CONCAT15((0 < sStack_57e) * (sStack_57e < 0x100) * auVar26[10] - (0xff < sStack_57e),
                      (undefined5)local_7b8);
        local_7b8._0_7_ =
             CONCAT16((0 < sStack_6d6) * (sStack_6d6 < 0x100) * auVar27[2] - (0xff < sStack_6d6),
                      (undefined6)local_7b8);
        local_7b8 = CONCAT17((0 < sStack_58e) * (sStack_58e < 0x100) * auVar27[10] -
                             (0xff < sStack_58e),(undefined7)local_7b8);
        uStack_7b0._0_1_ =
             (0 < sStack_6c4) * (sStack_6c4 < 0x100) * auVar26[4] - (0xff < sStack_6c4);
        uStack_7b0._1_1_ =
             (0 < sStack_57c) * (sStack_57c < 0x100) * auVar26[0xc] - (0xff < sStack_57c);
        uStack_7b0._2_1_ =
             (0 < sStack_6d4) * (sStack_6d4 < 0x100) * auVar27[4] - (0xff < sStack_6d4);
        uStack_7b0._3_1_ =
             (0 < sStack_58c) * (sStack_58c < 0x100) * auVar27[0xc] - (0xff < sStack_58c);
        uStack_7b0._4_1_ =
             (0 < sStack_6c2) * (sStack_6c2 < 0x100) * auVar26[6] - (0xff < sStack_6c2);
        uStack_7b0._5_1_ =
             (0 < sStack_57a) * (sStack_57a < 0x100) * auVar26[0xe] - (0xff < sStack_57a);
        uStack_7b0._6_1_ =
             (0 < sStack_6d2) * (sStack_6d2 < 0x100) * auVar27[6] - (0xff < sStack_6d2);
        uStack_7b0._7_1_ =
             (0 < sStack_58a) * (sStack_58a < 0x100) * auVar27[0xe] - (0xff < sStack_58a);
        *local_738 = local_7b8;
        local_738[1] = uStack_7b0;
        local_730 = local_730 + 0x10;
        local_738 = local_738 + 2;
      } while (local_738 <= puVar24 + -2);
      bVar25 = local_738 != puVar24;
      local_738 = puVar24 + -2;
      local_730 = in_RDX + (long)in_ESI + -0x10;
    } while (bVar25);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;
      STBIR_SIMD_NO_UNROLL(encode);

      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__min_max_shift20( i3, f3 );

      stbir__simdi_table_lookup4( i0, i1, i2, i3, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );
      stbir__linear_to_srgb_finish( i3, f3 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      encode += 16;
      output += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while ( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(encode);

    output[0-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    output[1-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    output[2-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    output[3-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order3] );

    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(encode);
    output[0] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    #if stbir__coder_min_num >= 2
    output[1] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}